

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskCountCase::init
          (SampleMaskCountCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  ShaderRunMode SVar2;
  int iVar3;
  undefined1 local_190 [384];
  
  SVar2 = (this->super_SampleMaskBaseCase).m_runMode;
  if (SVar2 == RUN_PER_TWO_SAMPLES) {
    local_190._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying gl_SampleMaskIn.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\tFragment shader may be invoked [ceil(numSamples/2), numSamples] times.\n",0x48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\t=> gl_SampleMaskIn should have the number of bits set in range [1, numSamples - ceil(numSamples/2) + 1]:\n"
               ,0x6a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else if (SVar2 == RUN_PER_SAMPLE) {
    local_190._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying gl_SampleMaskIn.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\tFragment will be invoked numSamples times.\n",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\t=> gl_SampleMaskIn should have only one bit set.\n",0x32);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (SVar2 != RUN_PER_PIXEL) goto LAB_0040b5f4;
    local_190._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying gl_SampleMaskIn.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\tFragment shader may be invoked [1, numSamples] times.\n",0x37);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\t=> gl_SampleMaskIn should have the number of bits set in range [1, numSamples]\n",
               0x50);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  ctx = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
LAB_0040b5f4:
  iVar3 = SampleMaskBaseCase::init(&this->super_SampleMaskBaseCase,ctx);
  return iVar3;
}

Assistant:

void SampleMaskCountCase::init (void)
{
	// log the test method and expectations
	if (m_runMode == RUN_PER_PIXEL)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying gl_SampleMaskIn.\n"
			<< "	Fragment shader may be invoked [1, numSamples] times.\n"
			<< "	=> gl_SampleMaskIn should have the number of bits set in range [1, numSamples]\n"
			<< tcu::TestLog::EndMessage;
	else if (m_runMode == RUN_PER_SAMPLE)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying gl_SampleMaskIn.\n"
			<< "	Fragment will be invoked numSamples times.\n"
			<< "	=> gl_SampleMaskIn should have only one bit set.\n"
			<< tcu::TestLog::EndMessage;
	else if (m_runMode == RUN_PER_TWO_SAMPLES)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying gl_SampleMaskIn.\n"
			<< "	Fragment shader may be invoked [ceil(numSamples/2), numSamples] times.\n"
			<< "	=> gl_SampleMaskIn should have the number of bits set in range [1, numSamples - ceil(numSamples/2) + 1]:\n"
			<< tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);

	SampleMaskBaseCase::init();
}